

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_donecanvasdialog(_glist *x,t_symbol *s,int argc,t_atom *argv)

{
  bool bVar1;
  bool bVar2;
  uint flag;
  int iVar3;
  void *data;
  uint uVar4;
  t_float tVar5;
  t_float tVar6;
  t_float tVar7;
  t_float tVar8;
  t_float tVar9;
  t_float tVar10;
  t_float tVar11;
  t_float tVar12;
  t_float tVar13;
  t_float tVar14;
  t_float tVar15;
  float fVar16;
  uint local_78;
  
  tVar5 = atom_getfloatarg(0,argc,argv);
  tVar6 = atom_getfloatarg(1,argc,argv);
  tVar7 = atom_getfloatarg(2,argc,argv);
  uVar4 = (uint)tVar7;
  tVar7 = atom_getfloatarg(3,argc,argv);
  tVar8 = atom_getfloatarg(4,argc,argv);
  tVar9 = atom_getfloatarg(5,argc,argv);
  tVar10 = atom_getfloatarg(6,argc,argv);
  tVar11 = atom_getfloatarg(7,argc,argv);
  tVar12 = atom_getfloatarg(8,argc,argv);
  tVar13 = atom_getfloatarg(9,argc,argv);
  tVar14 = atom_getfloatarg(10,argc,argv);
  tVar15 = atom_getfloatarg(0xb,argc,argv);
  flag = -(uVar4 & 1) & uVar4;
  if ((int)tVar15 == 0) {
    flag = uVar4;
  }
  data = canvas_undo_set_canvas(x);
  canvas_undo_add(x,UNDO_CANVAS_APPLY,"apply",data);
  x->gl_pixwidth = (int)tVar11;
  x->gl_pixheight = (int)tVar12;
  x->gl_xmargin = (int)tVar13;
  x->gl_ymargin = (int)tVar14;
  if (flag == 0) {
    tVar7 = (t_float)(-(uint)(tVar5 == 0.0) & 0x3f800000 | ~-(uint)(tVar5 == 0.0) & (uint)tVar5);
    uVar4 = -(uint)(tVar6 == -tVar6);
    local_78 = uVar4 & 0x3f800000;
    tVar5 = glist_dpixtodx(x,1.0);
    if ((tVar7 == tVar5) && (!NAN(tVar7) && !NAN(tVar5))) {
      glist_dpixtody(x,1.0);
    }
    tVar10 = (t_float)(~uVar4 & (uint)-tVar6 | local_78);
    if (tVar7 <= 0.0) {
      tVar5 = (float)(x->gl_screenx2 - x->gl_screenx1) * -tVar7;
      tVar7 = tVar7 + tVar5;
    }
    else {
      tVar5 = 0.0;
    }
    x->gl_x1 = tVar5;
    x->gl_x2 = tVar7;
    if (tVar10 <= 0.0) {
      fVar16 = (float)(x->gl_screeny2 - x->gl_screeny1) * -tVar10;
      x->gl_y1 = fVar16;
      tVar10 = tVar10 + fVar16;
    }
    else {
      x->gl_y1 = 0.0;
    }
  }
  else {
    bVar1 = NAN(tVar7);
    bVar2 = tVar7 == tVar9;
    if ((bVar2) && (!bVar1 && !NAN(tVar9))) {
      tVar7 = 0.0;
    }
    if ((bVar2) && (!bVar1 && !NAN(tVar9))) {
      tVar9 = 1.0;
    }
    x->gl_x1 = tVar7;
    x->gl_x2 = tVar9;
    if ((tVar8 != tVar10) || (NAN(tVar8) || NAN(tVar10))) {
      x->gl_y1 = tVar8;
    }
    else {
      x->gl_y1 = 0.0;
      tVar10 = 1.0;
    }
  }
  x->gl_y2 = tVar10;
  canvas_setgraph(x,flag,0);
  canvas_dirty(x,1.0);
  if ((*(ushort *)&x->field_0xe8 & 1) != 0) {
    canvas_redraw(x);
    return;
  }
  if (((*(ushort *)&x->field_0xe8 >> 0xb & 1) == 0) &&
     (iVar3 = glist_isvisible(x->gl_owner), iVar3 != 0)) {
    gobj_vis((t_gobj *)x,x->gl_owner,0);
    gobj_vis((t_gobj *)x,x->gl_owner,1);
    return;
  }
  return;
}

Assistant:

static void canvas_donecanvasdialog(t_glist *x,
    t_symbol *s, int argc, t_atom *argv)
{
    t_float xperpix, yperpix, x1, y1, x2, y2, xpix, ypix, xmargin, ymargin;
    int graphme, redraw = 0, fromgui;

    xperpix = atom_getfloatarg(0, argc, argv);
    yperpix = atom_getfloatarg(1, argc, argv);
    graphme = (int)(atom_getfloatarg(2, argc, argv));
    x1 = atom_getfloatarg(3, argc, argv);
    y1 = atom_getfloatarg(4, argc, argv);
    x2 = atom_getfloatarg(5, argc, argv);
    y2 = atom_getfloatarg(6, argc, argv);
    xpix = atom_getfloatarg(7, argc, argv);
    ypix = atom_getfloatarg(8, argc, argv);
    xmargin = atom_getfloatarg(9, argc, argv);
    ymargin = atom_getfloatarg(10, argc, argv);
    fromgui = atom_getfloatarg(11, argc, argv);
        /* hack - if graphme is 2 (meaning, not GOP but hide the text anyhow),
           perhaps we're happier with 0.  This is only checked if this is really
           being called, as intended, from the GUI.  For compatibility with old
           patches that reverse-engineered donecanvasdialog to modify patch
           parameters, we leave the buggy behavior in when there's no "fromgui"
           argument supplied. */
    if (fromgui && (!(graphme & 1)))
        graphme = 0;
        /* parent windows are treated the same as
           applies to individual objects */
    canvas_undo_add(x, UNDO_CANVAS_APPLY, "apply", canvas_undo_set_canvas(x));

    x->gl_pixwidth = xpix;
    x->gl_pixheight = ypix;
    x->gl_xmargin = xmargin;
    x->gl_ymargin = ymargin;

    yperpix = -yperpix;
    if (xperpix == 0)
        xperpix = 1;
    if (yperpix == 0)
        yperpix = 1;

    if (graphme)
    {
        if (x1 != x2)
            x->gl_x1 = x1, x->gl_x2 = x2;
        else x->gl_x1 = 0, x->gl_x2 = 1;
        if (y1 != y2)
            x->gl_y1 = y1, x->gl_y2 = y2;
        else x->gl_y1 = 0, x->gl_y2 = 1;
    }
    else
    {
        if (xperpix != glist_dpixtodx(x, 1) || yperpix != glist_dpixtody(x, 1))
            redraw = 1;
        if (xperpix > 0)
        {
            x->gl_x1 = 0;
            x->gl_x2 = xperpix;
        }
        else
        {
            x->gl_x1 = -xperpix * (x->gl_screenx2 - x->gl_screenx1);
            x->gl_x2 = x->gl_x1 + xperpix;
        }
        if (yperpix > 0)
        {
            x->gl_y1 = 0;
            x->gl_y2 = yperpix;
        }
        else
        {
            x->gl_y1 = -yperpix * (x->gl_screeny2 - x->gl_screeny1);
            x->gl_y2 = x->gl_y1 + yperpix;
        }
    }
        /* LATER avoid doing 2 redraws here (possibly one inside setgraph) */
    canvas_setgraph(x, graphme, 0);
    canvas_dirty(x, 1);
    if (x->gl_havewindow)
        canvas_redraw(x);
    else if (!x->gl_isclone && glist_isvisible(x->gl_owner))
    {
        gobj_vis(&x->gl_gobj, x->gl_owner, 0);
        gobj_vis(&x->gl_gobj, x->gl_owner, 1);
    }
}